

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistwidget.cpp
# Opt level: O0

bool __thiscall QListModel::clearItemData(QListModel *this,QModelIndex *index)

{
  bool bVar1;
  ulong uVar2;
  QModelIndex *in_RSI;
  QModelIndex *in_RDI;
  long in_FS_OFFSET;
  QListWidgetItem *item;
  const_iterator endIter;
  const_iterator beginIter;
  undefined4 in_stack_ffffffffffffff58;
  CheckIndexOption in_stack_ffffffffffffff5c;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  bool local_49;
  undefined1 local_48 [24];
  QWidgetItemData *local_30;
  QWidgetItemData *local_28;
  QWidgetItemData *local_20;
  QWidgetItemData *local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QFlags<QAbstractItemModel::CheckIndexOption>::QFlags
            ((QFlags<QAbstractItemModel::CheckIndexOption> *)
             CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),in_stack_ffffffffffffff5c
            );
  uVar2 = QAbstractItemModel::checkIndex(in_RDI,(QFlags_conflict1 *)in_RSI);
  if ((uVar2 & 1) == 0) {
    local_49 = false;
  }
  else {
    QModelIndex::row(in_RSI);
    QList<QListWidgetItem_*>::at
              ((QList<QListWidgetItem_*> *)
               CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
               CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    local_18 = (QWidgetItemData *)&DAT_aaaaaaaaaaaaaaaa;
    local_18 = (QWidgetItemData *)
               QList<QWidgetItemData>::cbegin
                         ((QList<QWidgetItemData> *)
                          CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
    local_20 = (QWidgetItemData *)&DAT_aaaaaaaaaaaaaaaa;
    local_30 = (QWidgetItemData *)
               QList<QWidgetItemData>::cend
                         ((QList<QWidgetItemData> *)
                          CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
    local_28 = local_18;
    local_20 = local_30;
    bVar1 = std::
            all_of<QList<QWidgetItemData>::const_iterator,QListModel::clearItemData(QModelIndex_const&)::__0>
                      (local_18);
    if (bVar1) {
      local_49 = true;
    }
    else {
      QList<QWidgetItemData>::clear
                ((QList<QWidgetItemData> *)
                 CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
      memset(local_48,0,0x18);
      QList<int>::QList((QList<int> *)0x89a71c);
      QAbstractItemModel::dataChanged(in_RDI,(QModelIndex *)in_RSI,(QList_conflict2 *)in_RSI);
      QList<int>::~QList((QList<int> *)0x89a73f);
      local_49 = true;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_49;
  }
  __stack_chk_fail();
}

Assistant:

bool QListModel::clearItemData(const QModelIndex &index)
{
    if (!checkIndex(index, CheckIndexOption::IndexIsValid))
        return false;
    QListWidgetItem *item = items.at(index.row());
    const auto beginIter = item->d->values.cbegin();
    const auto endIter = item->d->values.cend();
    if (std::all_of(beginIter, endIter, [](const QWidgetItemData& data) -> bool { return !data.value.isValid(); }))
        return true; //it's already cleared
    item->d->values.clear();
    emit dataChanged(index, index, QList<int> {});
    return true;
}